

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inject_sleigh.cc
# Opt level: O2

void InjectPayloadSleigh::checkParameterRestrictions
               (InjectContextSleigh *con,
               vector<InjectParameter,_std::allocator<InjectParameter>_> *inputlist,
               vector<InjectParameter,_std::allocator<InjectParameter>_> *output,string *source)

{
  pointer pIVar1;
  pointer pVVar2;
  long lVar3;
  long lVar4;
  LowlevelError *pLVar5;
  long lVar6;
  uint4 *puVar7;
  uint4 *puVar8;
  bool bVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  pIVar1 = (inputlist->super__Vector_base<InjectParameter,_std::allocator<InjectParameter>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar3 = ((long)(inputlist->super__Vector_base<InjectParameter,_std::allocator<InjectParameter>_>).
                 _M_impl.super__Vector_impl_data._M_finish - (long)pIVar1) / 0x28;
  pVVar2 = (con->super_InjectContext).inputlist.
           super__Vector_base<VarnodeData,_std::allocator<VarnodeData>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(con->super_InjectContext).inputlist.
                super__Vector_base<VarnodeData,_std::allocator<VarnodeData>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pVVar2;
  lVar6 = lVar4 % 0x18;
  if (lVar3 != lVar4 / 0x18) {
    pLVar5 = (LowlevelError *)__cxa_allocate_exception(0x20,lVar3,lVar6);
    std::operator+(&bStack_38,
                   "Injection parameter list has different number of parameters than p-code operation: "
                   ,source);
    LowlevelError::LowlevelError(pLVar5,&bStack_38);
    __cxa_throw(pLVar5,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  puVar7 = &pIVar1->size;
  puVar8 = &pVVar2->size;
  while( true ) {
    bVar9 = lVar3 == 0;
    lVar3 = lVar3 + -1;
    if (bVar9) {
      pIVar1 = (output->super__Vector_base<InjectParameter,_std::allocator<InjectParameter>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar3 = ((long)(output->super__Vector_base<InjectParameter,_std::allocator<InjectParameter>_>)
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1) / 0x28;
      pVVar2 = (con->super_InjectContext).output.
               super__Vector_base<VarnodeData,_std::allocator<VarnodeData>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = (long)(con->super_InjectContext).output.
                    super__Vector_base<VarnodeData,_std::allocator<VarnodeData>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pVVar2;
      lVar6 = lVar4 % 0x18;
      if (lVar3 != lVar4 / 0x18) {
        pLVar5 = (LowlevelError *)__cxa_allocate_exception(0x20,pIVar1,lVar6);
        std::operator+(&bStack_38,"Injection output does not match output of p-code operation: ",
                       source);
        LowlevelError::LowlevelError(pLVar5,&bStack_38);
        __cxa_throw(pLVar5,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
      puVar7 = &pIVar1->size;
      puVar8 = &pVVar2->size;
      while( true ) {
        bVar9 = lVar3 == 0;
        lVar3 = lVar3 + -1;
        if (bVar9) {
          return;
        }
        if ((*puVar7 != 0) && (*puVar7 != *puVar8)) break;
        puVar7 = puVar7 + 10;
        puVar8 = puVar8 + 6;
      }
      pLVar5 = (LowlevelError *)__cxa_allocate_exception(0x20,puVar7,lVar6);
      std::operator+(&bStack_38,"P-code output size does not match injection specification: ",source
                    );
      LowlevelError::LowlevelError(pLVar5,&bStack_38);
      __cxa_throw(pLVar5,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
    }
    if ((*puVar7 != 0) && (*puVar7 != *puVar8)) break;
    puVar7 = puVar7 + 10;
    puVar8 = puVar8 + 6;
  }
  pLVar5 = (LowlevelError *)__cxa_allocate_exception(0x20,lVar3,lVar6);
  std::operator+(&bStack_38,"P-code input parameter size does not match injection specification: ",
                 source);
  LowlevelError::LowlevelError(pLVar5,&bStack_38);
  __cxa_throw(pLVar5,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void InjectPayloadSleigh::checkParameterRestrictions(InjectContextSleigh &con,
						     const vector<InjectParameter> &inputlist,
						     const vector<InjectParameter> &output,
						     const string &source)
{ // Verify that the storage locations passed in -con- match the restrictions set for this payload
  if (inputlist.size() != con.inputlist.size())
    throw LowlevelError("Injection parameter list has different number of parameters than p-code operation: "+source);
  for(int4 i=0;i<inputlist.size();++i) {
    uint4 sz = inputlist[i].getSize();
    if ((sz != 0) && (sz != con.inputlist[i].size))
      throw LowlevelError("P-code input parameter size does not match injection specification: "+source);
  }
  if (output.size() != con.output.size())
    throw LowlevelError("Injection output does not match output of p-code operation: "+source);
  for(int4 i=0;i<output.size();++i) {
    uint4 sz = output[i].getSize();
    if ((sz != 0) && (sz != con.output[i].size))
      throw LowlevelError("P-code output size does not match injection specification: "+source);
  }
}